

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal.c
# Opt level: O0

void swap_screen(Terminal *term,wchar_t which,_Bool reset,_Bool keep_cur_pos)

{
  _Bool _Var1;
  tree234 *ptVar2;
  pos pVar3;
  truecolour tVar4;
  wchar_t wVar5;
  wchar_t local_40;
  wchar_t limit;
  tree234 *ttr;
  truecolour ttc;
  pos tp;
  _Bool bt;
  wchar_t t;
  _Bool keep_cur_pos_local;
  _Bool reset_local;
  wchar_t which_local;
  Terminal *term_local;
  
  bt = reset;
  if (which == L'\0') {
    bt = false;
  }
  if (which != term->alt_which) {
    if (((((term->erase_to_scrollback & 1U) != 0) && (term->alt_screen != (tree234 *)0x0)) &&
        (term->alt_which != L'\0')) &&
       ((term->disptop < L'\0' &&
        (term->disptop = term->alt_sblines + term->disptop, L'\0' < term->disptop)))) {
      term->disptop = L'\0';
    }
    term->alt_which = which;
    ptVar2 = term->alt_screen;
    term->alt_screen = term->screen;
    term->screen = ptVar2;
    if (term->alt_screen == (tree234 *)0x0) {
      local_40 = L'\0';
    }
    else {
      local_40 = find_last_nonempty_line(term,term->alt_screen);
      local_40 = local_40 + L'\x01';
    }
    term->alt_sblines = local_40;
    wVar5 = (term->curs).x;
    if (((bt & 1U) == 0) && (!keep_cur_pos)) {
      (term->curs).x = term->alt_x;
    }
    term->alt_x = wVar5;
    wVar5 = (term->curs).y;
    if (((bt & 1U) == 0) && (!keep_cur_pos)) {
      (term->curs).y = term->alt_y;
    }
    term->alt_y = wVar5;
    wVar5 = term->marg_t;
    if ((bt & 1U) == 0) {
      term->marg_t = term->alt_t;
    }
    term->alt_t = wVar5;
    wVar5 = term->marg_b;
    if ((bt & 1U) == 0) {
      term->marg_b = term->alt_b;
    }
    term->alt_b = wVar5;
    _Var1 = term->dec_om;
    if ((bt & 1U) == 0) {
      term->dec_om = (_Bool)(term->alt_om & 1);
    }
    term->alt_om = (_Bool)(_Var1 & 1);
    _Var1 = term->wrap;
    if ((bt & 1U) == 0) {
      term->wrap = (_Bool)(term->alt_wrap & 1);
    }
    term->alt_wrap = (_Bool)(_Var1 & 1);
    _Var1 = term->wrapnext;
    if ((bt & 1U) == 0) {
      term->wrapnext = (_Bool)(term->alt_wnext & 1);
    }
    term->alt_wnext = (_Bool)(_Var1 & 1);
    _Var1 = term->insert;
    if ((bt & 1U) == 0) {
      term->insert = (_Bool)(term->alt_ins & 1);
    }
    term->alt_ins = (_Bool)(_Var1 & 1);
    wVar5 = term->cset;
    if ((bt & 1U) == 0) {
      term->cset = term->alt_cset;
    }
    term->alt_cset = wVar5;
    _Var1 = term->utf;
    if ((bt & 1U) == 0) {
      term->utf = (_Bool)(term->alt_utf & 1);
    }
    term->alt_utf = (_Bool)(_Var1 & 1);
    wVar5 = term->sco_acs;
    if ((bt & 1U) == 0) {
      term->sco_acs = term->alt_sco_acs;
    }
    term->alt_sco_acs = wVar5;
    pVar3 = term->savecurs;
    if ((bt & 1U) == 0) {
      term->savecurs = term->alt_savecurs;
    }
    term->alt_savecurs = pVar3;
    wVar5 = term->save_cset;
    if ((bt & 1U) == 0) {
      term->save_cset = term->alt_save_cset;
    }
    term->alt_save_cset = wVar5;
    wVar5 = term->save_csattr;
    if ((bt & 1U) == 0) {
      term->save_csattr = term->alt_save_csattr;
    }
    term->alt_save_csattr = wVar5;
    wVar5 = term->save_attr;
    if ((bt & 1U) == 0) {
      term->save_attr = term->alt_save_attr;
    }
    term->alt_save_attr = wVar5;
    tVar4 = term->save_truecolour;
    if ((bt & 1U) == 0) {
      term->save_truecolour = term->alt_save_truecolour;
    }
    term->alt_save_truecolour = tVar4;
    _Var1 = term->save_utf;
    if ((bt & 1U) == 0) {
      term->save_utf = (_Bool)(term->alt_save_utf & 1);
    }
    term->alt_save_utf = (_Bool)(_Var1 & 1);
    _Var1 = term->save_wnext;
    if ((bt & 1U) == 0) {
      term->save_wnext = (_Bool)(term->alt_save_wnext & 1);
    }
    term->alt_save_wnext = (_Bool)(_Var1 & 1);
    wVar5 = term->save_sco_acs;
    if ((bt & 1U) == 0) {
      term->save_sco_acs = term->alt_save_sco_acs;
    }
    term->alt_save_sco_acs = wVar5;
    if (((((term->erase_to_scrollback & 1U) != 0) && (term->alt_screen != (tree234 *)0x0)) &&
        (term->alt_which != L'\0')) && (term->disptop < L'\0')) {
      term->disptop = term->disptop - term->alt_sblines;
      wVar5 = sblines(term);
      if (term->disptop < -wVar5) {
        term->disptop = -wVar5;
      }
    }
  }
  if (((bt & 1U) != 0) && (term->screen != (tree234 *)0x0)) {
    erase_lots(term,false,true,true);
  }
  return;
}

Assistant:

static void swap_screen(Terminal *term, int which,
                        bool reset, bool keep_cur_pos)
{
    int t;
    bool bt;
    pos tp;
    truecolour ttc;
    tree234 *ttr;

    if (!which)
        reset = false;                 /* do no weird resetting if which==0 */

    if (which != term->alt_which) {
        if (term->erase_to_scrollback && term->alt_screen &&
            term->alt_which && term->disptop < 0) {
            /*
             * We're swapping away from the alternate screen, so some
             * lines are about to vanish from the virtual scrollback.
             * Adjust disptop by that much, so that (if we're not
             * resetting the scrollback anyway on a display event) the
             * current scroll position still ends up pointing at the
             * same text.
             */
            term->disptop += term->alt_sblines;
            if (term->disptop > 0)
                term->disptop = 0;
        }

        term->alt_which = which;

        ttr = term->alt_screen;
        term->alt_screen = term->screen;
        term->screen = ttr;
        term->alt_sblines = (
            term->alt_screen ?
            find_last_nonempty_line(term, term->alt_screen) + 1 : 0);
        t = term->curs.x;
        if (!reset && !keep_cur_pos)
            term->curs.x = term->alt_x;
        term->alt_x = t;
        t = term->curs.y;
        if (!reset && !keep_cur_pos)
            term->curs.y = term->alt_y;
        term->alt_y = t;
        t = term->marg_t;
        if (!reset) term->marg_t = term->alt_t;
        term->alt_t = t;
        t = term->marg_b;
        if (!reset) term->marg_b = term->alt_b;
        term->alt_b = t;
        bt = term->dec_om;
        if (!reset) term->dec_om = term->alt_om;
        term->alt_om = bt;
        bt = term->wrap;
        if (!reset) term->wrap = term->alt_wrap;
        term->alt_wrap = bt;
        bt = term->wrapnext;
        if (!reset) term->wrapnext = term->alt_wnext;
        term->alt_wnext = bt;
        bt = term->insert;
        if (!reset) term->insert = term->alt_ins;
        term->alt_ins = bt;
        t = term->cset;
        if (!reset) term->cset = term->alt_cset;
        term->alt_cset = t;
        bt = term->utf;
        if (!reset) term->utf = term->alt_utf;
        term->alt_utf = bt;
        t = term->sco_acs;
        if (!reset) term->sco_acs = term->alt_sco_acs;
        term->alt_sco_acs = t;

        tp = term->savecurs;
        if (!reset)
            term->savecurs = term->alt_savecurs;
        term->alt_savecurs = tp;
        t = term->save_cset;
        if (!reset)
            term->save_cset = term->alt_save_cset;
        term->alt_save_cset = t;
        t = term->save_csattr;
        if (!reset)
            term->save_csattr = term->alt_save_csattr;
        term->alt_save_csattr = t;
        t = term->save_attr;
        if (!reset)
            term->save_attr = term->alt_save_attr;
        term->alt_save_attr = t;
        ttc = term->save_truecolour;
        if (!reset)
            term->save_truecolour = term->alt_save_truecolour;
        term->alt_save_truecolour = ttc;
        bt = term->save_utf;
        if (!reset)
            term->save_utf = term->alt_save_utf;
        term->alt_save_utf = bt;
        bt = term->save_wnext;
        if (!reset)
            term->save_wnext = term->alt_save_wnext;
        term->alt_save_wnext = bt;
        t = term->save_sco_acs;
        if (!reset)
            term->save_sco_acs = term->alt_save_sco_acs;
        term->alt_save_sco_acs = t;

        if (term->erase_to_scrollback && term->alt_screen &&
            term->alt_which && term->disptop < 0) {
            /*
             * Inverse of the adjustment at the top of this function.
             * This time, we're swapping _to_ the alternate screen, so
             * some lines are about to _appear_ in the virtual
             * scrollback, and we adjust disptop in the other
             * direction.
             *
             * Both these adjustments depend on the value stored in
             * term->alt_sblines while the alt screen is selected,
             * which is why we had to do one _before_ switching away
             * from it and the other _after_ switching to it.
             */
            term->disptop -= term->alt_sblines;
            int limit = -sblines(term);
            if (term->disptop < limit)
                term->disptop = limit;
        }
    }

    if (reset && term->screen) {
        /*
         * Yes, this _is_ supposed to honour background-colour-erase.
         */
        erase_lots(term, false, true, true);
    }
}